

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

void __thiscall
tchecker::clock_constraints_visitor_t::add_constraints
          (clock_constraints_visitor_t *this,clock_id_t first,clock_id_t second,binary_operator_t op
          ,integer_t value)

{
  invalid_argument *this_00;
  ineq_cmp_t *__args_2;
  uint *__args_1;
  clock_id_t *__args;
  clock_constraint_container_t *this_01;
  ineq_cmp_t *__args_3;
  integer_t neg_value;
  clock_id_t local_2c;
  clock_id_t local_28;
  ineq_cmp_t local_24;
  ineq_cmp_t local_20;
  ineq_cmp_t local_1c [3];
  
  local_2c = second;
  local_28 = first;
  local_20 = value;
  switch(op) {
  case EXPR_OP_LT:
    this_01 = this->_c;
    local_24 = LT;
    break;
  case EXPR_OP_LE:
    this_01 = this->_c;
    local_24 = LE;
    break;
  case EXPR_OP_EQ:
    local_1c[1] = 1;
    local_24 = first;
    local_1c[0] = second;
    local_1c[2] = value;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               this->_c,&local_24,local_1c,local_1c + 1,(int *)(local_1c + 2));
    add_constraints(this,local_28,local_2c,EXPR_OP_GE,local_20);
    return;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Unexpected expression operator in clock constraint");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case EXPR_OP_GE:
    this_01 = this->_c;
    local_1c[0] = LE;
    goto LAB_0013a340;
  case EXPR_OP_GT:
    this_01 = this->_c;
    local_1c[0] = LT;
LAB_0013a340:
    local_24 = -value;
    __args_2 = local_1c;
    __args_3 = &local_24;
    __args = &local_2c;
    __args_1 = &local_28;
    goto LAB_0013a36d;
  }
  __args_2 = &local_24;
  __args = &local_28;
  __args_1 = &local_2c;
  __args_3 = &local_20;
LAB_0013a36d:
  std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
  emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
            ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
             this_01,__args,__args_1,__args_2,(int *)__args_3);
  return;
}

Assistant:

void add_constraints(tchecker::clock_id_t first, tchecker::clock_id_t second, enum tchecker::binary_operator_t op,
                       tchecker::integer_t value)
  {
    switch (op) {
    case tchecker::EXPR_OP_EQ:
      add_constraints(first, second, tchecker::EXPR_OP_LE, value);
      add_constraints(first, second, tchecker::EXPR_OP_GE, value);
      break;
    case tchecker::EXPR_OP_GE: {
      tchecker::integer_t neg_value = static_cast<tchecker::integer_t>(-value);
      _c.emplace_back(second, first, tchecker::LE, neg_value);
      break;
    }
    case tchecker::EXPR_OP_GT: {
      tchecker::integer_t neg_value = static_cast<tchecker::integer_t>(-value);
      _c.emplace_back(second, first, tchecker::LT, neg_value);
      break;
    }
    case tchecker::EXPR_OP_LE:
      _c.emplace_back(first, second, tchecker::LE, value);
      break;
    case tchecker::EXPR_OP_LT:
      _c.emplace_back(first, second, tchecker::LT, value);
      break;
    default:
      throw std::invalid_argument("Unexpected expression operator in clock constraint");
    }
  }